

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib643.c
# Opt level: O3

int test(char *URL)

{
  int iVar1;
  uint uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  
  iVar1 = curl_global_init(3);
  if (iVar1 == 0) {
    uVar2 = once(URL,true);
    if ((uVar2 == 0) && (uVar2 = once(URL,false), uVar2 == 0)) {
      uVar3 = curl_easy_init();
      uVar4 = curl_mime_init(uVar3);
      uVar5 = curl_mime_addpart(uVar4);
      iVar1 = curl_mime_subparts(uVar5,uVar4);
      uVar2 = 1;
      if (iVar1 == 0x2b) {
        uVar6 = curl_mime_init(uVar3);
        uVar7 = curl_mime_addpart(uVar6);
        curl_mime_subparts(uVar5,uVar6);
        iVar1 = curl_mime_subparts(uVar7,uVar4);
        uVar2 = (uint)(iVar1 != 0x2b);
      }
      curl_mime_free(uVar4);
      curl_easy_cleanup(uVar3);
    }
    curl_global_cleanup();
  }
  else {
    curl_mfprintf(_stderr,"curl_global_init() failed\n");
    uVar2 = 0x7e;
  }
  return uVar2;
}

Assistant:

int test(char *URL)
{
  int res;

  if(curl_global_init(CURL_GLOBAL_ALL) != CURLE_OK) {
    fprintf(stderr, "curl_global_init() failed\n");
    return TEST_ERR_MAJOR_BAD;
  }

  res = once(URL, TRUE); /* old */
  if(!res)
    res = once(URL, FALSE); /* new */

  if(!res)
    res = cyclic_add();

  curl_global_cleanup();

  return res;
}